

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

bool __thiscall
ON_ObjRefEvaluationParameter::GetSubDComponentParameter
          (ON_ObjRefEvaluationParameter *this,ON_SubDComponentParameter *cp)

{
  double dVar1;
  TYPE TVar2;
  double dVar3;
  double dVar4;
  anon_union_8_3_6bf0bb0e_for_m_p0 aVar5;
  ON_SubDFaceParameter fp_00;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  bool bVar10;
  ON_SubDComponentId OVar11;
  ON_SubDComponentId active_face_id;
  ON_SubDFaceParameter *this_00;
  ON_SubDFaceCornerDex cdex;
  ON_SubDComponentId vertex_id;
  ON_SubDComponentId face_id;
  ON_SubDFaceParameter fp;
  
  cp->m_p1 = ON_SubDComponentParameter::Unset.m_p1;
  aVar5 = ON_SubDComponentParameter::Unset.m_p0;
  cp->m_cid = ON_SubDComponentParameter::Unset.m_cid;
  cp->m_p0 = aVar5;
  if (this->m_t_type != 9) goto LAB_005dc258;
  TVar2 = (this->m_t_ci).m_type;
  if (TVar2 == subd_face) {
    dVar1 = this->m_t[0];
    dVar3 = floor(dVar1);
    if (((dVar1 < 0.0) || (4294967295.0 < dVar1)) || (dVar3 != dVar1)) goto LAB_005dc258;
    dVar3 = this->m_t[1];
    dVar4 = floor(dVar3);
    if (((((dVar3 <= dVar1) || (dVar3 < 0.0)) ||
         ((4294967295.0 < dVar3 || ((dVar4 != dVar3 || (NAN(dVar4) || NAN(dVar3))))))) ||
        (this->m_t[2] < 0.0)) ||
       (((0.5 < this->m_t[2] || (this->m_t[3] < 0.0)) || (0.5 < this->m_t[3])))) goto LAB_005dc258;
    ON_SubDComponentId::ON_SubDComponentId(&face_id,Face,(this->m_t_ci).m_index);
    ON_SubDFaceCornerDex::ON_SubDFaceCornerDex
              (&cdex,(uint)(long)this->m_t[0],(uint)(long)this->m_t[1]);
    ON_SubDFaceParameter::ON_SubDFaceParameter(&fp,cdex,this->m_t[2],this->m_t[3]);
    this_00 = (ON_SubDFaceParameter *)&vertex_id;
    fp_00.m_s = fp.m_s;
    fp_00.m_cdex = fp.m_cdex;
    fp_00._4_4_ = fp._4_4_;
    fp_00.m_t = fp.m_t;
    ON_SubDComponentParameter::ON_SubDComponentParameter
              ((ON_SubDComponentParameter *)this_00,face_id,fp_00);
  }
  else if (TVar2 == subd_edge) {
    dVar1 = this->m_t[0];
    dVar3 = floor(dVar1);
    if ((((dVar1 < 0.0) || (4294967295.0 < dVar1)) ||
        ((dVar3 != dVar1 || ((NAN(dVar3) || NAN(dVar1) || (this->m_t[1] < 0.0)))))) ||
       ((1.0 < this->m_t[1] ||
        ((((this->m_t[2] != 0.0 || (NAN(this->m_t[2]))) || (this->m_t[3] != 0.0)) ||
         (NAN(this->m_t[3]))))))) goto LAB_005dc258;
    ON_SubDComponentId::ON_SubDComponentId(&vertex_id,Edge,(this->m_t_ci).m_index);
    dVar1 = this->m_t[1];
    OVar11 = Internal_ComponentIdFromDouble(Face,this->m_t[0]);
    this_00 = &fp;
    ON_SubDComponentParameter::ON_SubDComponentParameter
              ((ON_SubDComponentParameter *)this_00,vertex_id,dVar1,OVar11);
  }
  else {
    if (TVar2 != subd_vertex) goto LAB_005dc258;
    dVar1 = this->m_t[0];
    dVar3 = floor(dVar1);
    if (((dVar1 < 0.0) || (4294967295.0 < dVar1)) ||
       ((dVar3 != dVar1 || (NAN(dVar3) || NAN(dVar1))))) goto LAB_005dc258;
    dVar1 = this->m_t[1];
    bVar10 = true;
    if ((0.0 <= dVar1) && (dVar1 <= 4294967295.0)) {
      dVar3 = floor(dVar1);
      bVar10 = dVar3 != dVar1;
    }
    if ((((bVar10) || (this->m_t[2] != 0.0)) || (NAN(this->m_t[2]))) ||
       ((this->m_t[3] != 0.0 || (NAN(this->m_t[3]))))) goto LAB_005dc258;
    ON_SubDComponentId::ON_SubDComponentId(&vertex_id,Vertex,(this->m_t_ci).m_index);
    OVar11 = Internal_ComponentIdFromDouble(Edge,this->m_t[0]);
    active_face_id = Internal_ComponentIdFromDouble(Face,this->m_t[1]);
    this_00 = &fp;
    ON_SubDComponentParameter::ON_SubDComponentParameter
              ((ON_SubDComponentParameter *)this_00,vertex_id,OVar11,active_face_id);
  }
  cp->m_p1 = *(anon_union_8_3_7b68a318_for_m_p1 *)&this_00->m_t;
  uVar6 = this_00->field_0x4;
  uVar7 = this_00->field_0x5;
  uVar8 = this_00->field_0x6;
  uVar9 = this_00->field_0x7;
  aVar5 = *(anon_union_8_3_6bf0bb0e_for_m_p0 *)&this_00->m_s;
  (cp->m_cid).m_id = (uint)this_00->m_cdex;
  (cp->m_cid).m_type_and_dir = uVar6;
  (cp->m_cid).m_valueAB[0] = uVar7;
  (cp->m_cid).m_valueAB[1] = uVar8;
  (cp->m_cid).m_valueAB[2] = uVar9;
  cp->m_p0 = aVar5;
LAB_005dc258:
  bVar10 = ON_SubDComponentParameter::IsSet(cp);
  return bVar10;
}

Assistant:

bool ON_ObjRefEvaluationParameter::GetSubDComponentParameter(
  ON_SubDComponentParameter& cp
) const
{
  cp = ON_SubDComponentParameter::Unset;
  if (9 == this->m_t_type)
  {
    switch (this->m_t_ci.m_type)
    {
    case ON_COMPONENT_INDEX::TYPE::subd_vertex:
      if (false == Internal_IsValidUnsigned(this->m_t[0]))
        break;
      if (false == Internal_IsValidUnsigned(this->m_t[1]))
        break;
      if (false == (0.0 == this->m_t[2]))
        break;
      if (false == (0.0 == this->m_t[3]))
        break;
      {
        const ON_SubDComponentId vertex_id(ON_SubDComponentPtr::Type::Vertex, this->m_t_ci.m_index);
        cp = ON_SubDComponentParameter(
          vertex_id, 
          Internal_ComponentIdFromDouble(ON_SubDComponentPtr::Type::Edge, this->m_t[0]),
          Internal_ComponentIdFromDouble(ON_SubDComponentPtr::Type::Face, this->m_t[1]));
      }
      break;
    case ON_COMPONENT_INDEX::TYPE::subd_edge:
      if (false == Internal_IsValidUnsigned(this->m_t[0]))
        break;
      if (false == (0.0 <= this->m_t[1] && this->m_t[1] <= 1.0))
        break;
      if (false == (0.0 == this->m_t[2]))
        break;
      if (false == (0.0 == this->m_t[3]))
        break;
      {
        const ON_SubDComponentId edge_id(ON_SubDComponentPtr::Type::Edge, this->m_t_ci.m_index);
        cp = ON_SubDComponentParameter(
          edge_id,
          this->m_t[1],
          Internal_ComponentIdFromDouble(ON_SubDComponentPtr::Type::Face, this->m_t[0]));
      }
      break;
    case ON_COMPONENT_INDEX::TYPE::subd_face:
      if (false == Internal_IsValidUnsigned(this->m_t[0]))
        break;
      if (false == Internal_IsValidUnsigned(this->m_t[1]))
        break;
      if (false == (this->m_t[0] < this->m_t[1]))
        break;
      if (false == (0.0 <= this->m_t[2] && this->m_t[2] <= 0.5))
        break;
      if (false == (0.0 <= this->m_t[3] && this->m_t[3] <= 0.5))
        break;
      {
        const ON_SubDComponentId face_id(ON_SubDComponentPtr::Type::Face, this->m_t_ci.m_index);
        const ON_SubDFaceCornerDex cdex((unsigned)this->m_t[0], (unsigned)this->m_t[1]);
        ON_SubDFaceParameter fp(cdex, this->m_t[2], this->m_t[3]);
        cp = ON_SubDComponentParameter(face_id, fp);
      }
      break;
    default:
      break;
    }
  }
  return cp.IsSet();
}